

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::Bitstream::resizeToRange
          (ConstantValue *__return_storage_ptr__,ConstantValue *value,ConstantRange range,
          ConstantValue *defaultValue,bool keepArray)

{
  pointer *this;
  bool bVar1;
  int32_t iVar2;
  bitwidth_t bVar3;
  ulong uVar4;
  size_t sVar5;
  ConstantValue *pCVar6;
  uint *puVar7;
  const_iterator pCVar8;
  const_iterator pCVar9;
  SVQueue *pSVar10;
  size_type sVar11;
  uint local_21c;
  iterator local_1f0;
  iterator local_1d0;
  const_iterator local_1b0;
  allocator<slang::ConstantValue> local_189;
  const_iterator local_188;
  _Self local_168;
  const_iterator local_148;
  _Self local_128;
  undefined1 local_108 [8];
  SVQueue sliceValue_1;
  Queue *old_1;
  __normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
  local_a0;
  const_iterator local_98;
  ConstantValue *local_90;
  __normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
  local_88;
  const_iterator local_80;
  undefined1 local_68 [8];
  Elements sliceValue;
  span<slang::ConstantValue,_18446744073709551615UL> old;
  uint local_38;
  uint32_t more;
  uint32_t size;
  uint32_t lower;
  uint32_t upper;
  bool keepArray_local;
  ConstantValue *defaultValue_local;
  ConstantValue *value_local;
  ConstantRange range_local;
  
  value_local._0_4_ = range.left;
  value_local._4_4_ = range.right;
  lower._3_1_ = keepArray;
  _upper = defaultValue;
  defaultValue_local = value;
  value_local = (ConstantValue *)range;
  range_local = (ConstantRange)__return_storage_ptr__;
  if (((int)value_local != value_local._4_4_) || (keepArray)) {
    iVar2 = ConstantRange::lower((ConstantRange *)&value_local);
    if (iVar2 < 1) {
      bVar3 = ConstantRange::width((ConstantRange *)&value_local);
      sVar5 = slang::ConstantValue::size(defaultValue_local);
      if (bVar3 == sVar5) {
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,defaultValue_local);
        return __return_storage_ptr__;
      }
    }
    size = ConstantRange::upper((ConstantRange *)&value_local);
    more = ConstantRange::lower((ConstantRange *)&value_local);
    sVar5 = slang::ConstantValue::size(defaultValue_local);
    local_38 = (uint)sVar5;
    if (size < local_38) {
      local_21c = 0;
    }
    else {
      local_21c = (size - local_38) + 1;
    }
    old.size_._4_4_ = local_21c;
    old.size_._0_4_ = size + 1;
    puVar7 = std::min<unsigned_int>((uint *)&old.size_,&local_38);
    size = *puVar7;
    bVar1 = slang::ConstantValue::isUnpacked(defaultValue_local);
    if (bVar1) {
      join_0x00000010_0x00000000_ = slang::ConstantValue::elements(defaultValue_local);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_68);
      bVar3 = ConstantRange::width((ConstantRange *)&value_local);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_68,
                 (ulong)bVar3);
      local_88._M_current =
           (ConstantValue *)
           std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                     ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                      local_68);
      __gnu_cxx::
      __normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>
      ::__normal_iterator<slang::ConstantValue*>
                ((__normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>
                  *)&local_80,&local_88);
      this = &sliceValue.
              super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      pCVar8 = nonstd::span_lite::span<slang::ConstantValue,_18446744073709551615UL>::cbegin
                         ((span<slang::ConstantValue,_18446744073709551615UL> *)this);
      uVar4 = (ulong)more;
      pCVar9 = nonstd::span_lite::span<slang::ConstantValue,_18446744073709551615UL>::cbegin
                         ((span<slang::ConstantValue,_18446744073709551615UL> *)this);
      local_90 = (ConstantValue *)
                 std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
                 insert<slang::ConstantValue_const*,void>
                           ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)
                            local_68,local_80,pCVar8 + uVar4,pCVar9 + size);
      local_a0._M_current =
           (ConstantValue *)
           std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                     ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                      local_68);
      __gnu_cxx::
      __normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>
      ::__normal_iterator<slang::ConstantValue*>
                ((__normal_iterator<slang::ConstantValue_const*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>
                  *)&local_98,&local_a0);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_68,
                 local_98,(ulong)old.size_._4_4_,defaultValue);
      sVar11 = std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                         ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                          local_68);
      bVar3 = ConstantRange::width((ConstantRange *)&value_local);
      if (sVar11 != bVar3) {
        assert::assertFailed
                  ("sliceValue.size() == range.width()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                   ,0x353,
                   "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                  );
      }
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(Elements *)local_68);
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_68);
    }
    else {
      bVar1 = slang::ConstantValue::isQueue(defaultValue_local);
      if (!bVar1) {
        assert::assertFailed
                  ("value.isQueue()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                   ,0x357,
                   "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                  );
      }
      sliceValue_1._80_8_ = slang::ConstantValue::queue(defaultValue_local);
      pSVar10 = CopyPtr<slang::SVQueue>::operator->((CopyPtr<slang::SVQueue> *)sliceValue_1._80_8_);
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::cbegin
                (&local_148,
                 &pSVar10->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
      ;
      std::operator+(&local_128,&local_148,(ulong)more);
      pSVar10 = CopyPtr<slang::SVQueue>::operator->((CopyPtr<slang::SVQueue> *)sliceValue_1._80_8_);
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::cbegin
                (&local_188,
                 &pSVar10->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
      ;
      std::operator+(&local_168,&local_188,(ulong)size);
      std::allocator<slang::ConstantValue>::allocator(&local_189);
      SVQueue::
      deque<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::SVQueue::deque*>,void>
                ((SVQueue *)local_108,&local_128,&local_168,&local_189);
      std::allocator<slang::ConstantValue>::~allocator(&local_189);
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                (&local_1d0,
                 (deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_108);
      std::
      _Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>
      ::
      _Deque_iterator<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
                ((_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>
                  *)&local_1b0,&local_1d0);
      std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
                (&local_1f0,
                 (deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_108,
                 &local_1b0,(ulong)old.size_._4_4_,defaultValue);
      sVar11 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                         ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                          local_108);
      bVar3 = ConstantRange::width((ConstantRange *)&value_local);
      if (sVar11 != bVar3) {
        assert::assertFailed
                  ("sliceValue.size() == range.width()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                   ,0x35b,
                   "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                  );
      }
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVQueue *)local_108);
      SVQueue::~SVQueue((SVQueue *)local_108);
    }
  }
  else {
    uVar4 = (ulong)(int)value_local;
    sVar5 = slang::ConstantValue::size(value);
    if (uVar4 < sVar5) {
      pCVar6 = slang::ConstantValue::at(defaultValue_local,(long)(int)value_local);
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,pCVar6);
    }
    else {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,defaultValue);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::resizeToRange(ConstantValue&& value, ConstantRange range,
                                       ConstantValue defaultValue, bool keepArray) {
    if (range.left == range.right && !keepArray) {
        if (size_t(range.left) >= value.size())
            return defaultValue;
        else
            return std::move(value).at(size_t(range.left));
    }

    if (range.lower() > 0 || range.width() != value.size()) {
        auto upper = static_cast<uint32_t>(range.upper());
        auto lower = static_cast<uint32_t>(range.lower());
        auto size = static_cast<uint32_t>(value.size());
        auto more = upper >= size ? upper - size + 1 : 0;
        upper = std::min(upper + 1, size);

        if (value.isUnpacked()) {
            const auto old = value.elements();
            ConstantValue::Elements sliceValue;
            sliceValue.reserve(range.width());
            sliceValue.insert(sliceValue.end(), old.cbegin() + lower, old.cbegin() + upper);
            sliceValue.insert(sliceValue.end(), more, defaultValue);
            ASSERT(sliceValue.size() == range.width());
            return sliceValue;
        }
        else {
            ASSERT(value.isQueue());
            const auto& old = value.queue();
            SVQueue sliceValue(old->cbegin() + lower, old->cbegin() + upper);
            sliceValue.insert(sliceValue.end(), more, defaultValue);
            ASSERT(sliceValue.size() == range.width());
            return sliceValue;
        }
    }

    return std::move(value);
}